

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyValue
          (ParserImpl *this,Descriptor *value_descriptor,string *serialized_value)

{
  bool bVar1;
  MessageLite *pMVar2;
  string_view message;
  string sub_delimiter;
  DynamicMessageFactory factory;
  string local_160;
  undefined1 local_140 [32];
  string local_120;
  DynamicMessageFactory local_100;
  undefined8 local_c0;
  char *local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  
  DynamicMessageFactory::DynamicMessageFactory(&local_100);
  pMVar2 = &DynamicMessageFactory::GetPrototype(&local_100,value_descriptor)->super_MessageLite;
  if (pMVar2 == (MessageLite *)0x0) {
    bVar1 = false;
    goto LAB_00308a33;
  }
  pMVar2 = MessageLite::New(pMVar2,(Arena *)0x0);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeMessageDelimiter(this,&local_160);
  if (bVar1) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    bVar1 = ConsumeMessage(this,(Message *)pMVar2,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) goto LAB_00308a07;
    if (this->allow_partial_ == true) {
      bVar1 = true;
      MessageLite::AppendPartialToString(pMVar2,serialized_value);
    }
    else {
      bVar1 = MessageLite::IsInitialized(pMVar2);
      if (!bVar1) {
        local_60.piece_._M_len = 0xf;
        local_60.piece_._M_str = "Value of type \"";
        local_90.piece_._M_str = value_descriptor->all_names_[1]._M_dataplus._M_p;
        local_90.piece_._M_len = value_descriptor->all_names_[1]._M_string_length;
        local_c0 = 0x3b;
        local_b8 = "\" stored in google.protobuf.Any has missing required fields";
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_140,&local_60,&local_90);
        message._M_str = (char *)local_140._0_8_;
        message._M_len = local_140._8_8_;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message
                   );
        if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
        goto LAB_00308a07;
      }
      bVar1 = true;
      MessageLite::AppendToString(pMVar2,serialized_value);
    }
  }
  else {
LAB_00308a07:
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,
                    CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                             local_160.field_2._M_local_buf[0]) + 1);
  }
  if (pMVar2 != (MessageLite *)0x0) {
    (*pMVar2->_vptr_MessageLite[1])(pMVar2);
  }
LAB_00308a33:
  DynamicMessageFactory::~DynamicMessageFactory(&local_100);
  return bVar1;
}

Assistant:

bool ConsumeAnyValue(const Descriptor* value_descriptor,
                       std::string* serialized_value) {
    DynamicMessageFactory factory;
    const Message* value_prototype = factory.GetPrototype(value_descriptor);
    if (value_prototype == nullptr) {
      return false;
    }
    std::unique_ptr<Message> value(value_prototype->New());
    std::string sub_delimiter;
    DO(ConsumeMessageDelimiter(&sub_delimiter));
    DO(ConsumeMessage(value.get(), sub_delimiter));

    if (allow_partial_) {
      value->AppendPartialToString(serialized_value);
    } else {
      if (!value->IsInitialized()) {
        ReportError(absl::StrCat(
            "Value of type \"", value_descriptor->full_name(),
            "\" stored in google.protobuf.Any has missing required fields"));
        return false;
      }
      value->AppendToString(serialized_value);
    }
    return true;
  }